

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O2

void __thiscall F7ZFile::~F7ZFile(F7ZFile *this)

{
  F7ZLump *pFVar1;
  long lVar2;
  C7zArchive *this_00;
  long lVar3;
  
  (this->super_FResourceFile)._vptr_FResourceFile = (_func_int **)&PTR__F7ZFile_007e5958;
  pFVar1 = this->Lumps;
  if (pFVar1 != (F7ZLump *)0x0) {
    lVar2 = *(long *)&pFVar1[-1].super_FResourceLump.Namespace;
    if (lVar2 != 0) {
      lVar3 = lVar2 * 0x50;
      do {
        FResourceLump::~FResourceLump
                  ((FResourceLump *)
                   ((long)&pFVar1[-1].super_FResourceLump._vptr_FResourceLump + lVar3));
        lVar3 = lVar3 + -0x50;
      } while (lVar3 != 0);
    }
    operator_delete__(&pFVar1[-1].super_FResourceLump.Namespace,lVar2 * 0x50 | 8);
  }
  this_00 = this->Archive;
  if (this_00 != (C7zArchive *)0x0) {
    C7zArchive::~C7zArchive(this_00);
    operator_delete(this_00,0x4140);
  }
  FResourceFile::~FResourceFile(&this->super_FResourceFile);
  return;
}

Assistant:

F7ZFile::~F7ZFile()
{
	if (Lumps != NULL)
	{
		delete[] Lumps;
	}
	if (Archive != NULL)
	{
		delete Archive;
	}
}